

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
kj::ArrayBuilder<capnp::(anonymous_namespace)::CppTypeName>::
addAll<capnp::(anonymous_namespace)::CppTypeName*,false>
          (ArrayBuilder<capnp::(anonymous_namespace)::CppTypeName> *this,CppTypeName *start,
          CppTypeName *end)

{
  CppTypeName *pCVar1;
  CppTypeName *end_local;
  CppTypeName *start_local;
  ArrayBuilder<capnp::(anonymous_namespace)::CppTypeName> *this_local;
  
  pCVar1 = _::
           CopyConstructArray_<capnp::(anonymous_namespace)::CppTypeName,_capnp::(anonymous_namespace)::CppTypeName_*,_false,_false>
           ::apply(this->pos,start,end);
  this->pos = pCVar1;
  return;
}

Assistant:

void ArrayBuilder<T>::addAll(Iterator start, Iterator end) {
  pos = _::CopyConstructArray_<RemoveConst<T>, Decay<Iterator>, move>::apply(pos, start, end);
}